

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_mem_stream.cpp
# Opt level: O2

void __thiscall
dpfb::streams::ConstMemStream::ConstMemStream(ConstMemStream *this,void *data,size_t dataSize)

{
  StreamError *this_00;
  
  (this->super_Stream)._vptr_Stream = (_func_int **)&PTR__Stream_00128c28;
  this->data = (uint8_t *)data;
  this->dataSize = dataSize;
  this->pos = 0;
  if (data != (void *)0x0) {
    return;
  }
  this_00 = (StreamError *)__cxa_allocate_exception(0x10);
  StreamError::runtime_error(this_00,"data is nullptr");
  __cxa_throw(this_00,&StreamError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ConstMemStream::ConstMemStream(const void* data, std::size_t dataSize)
    : data {static_cast<const std::uint8_t*>(data)}
    , dataSize {dataSize}
    , pos {0}
{
    if (!data)
        throw StreamError("data is nullptr");
}